

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

void IoTHubMessaging_LL_SenderStateChanged
               (void *context,MESSAGE_SENDER_STATE new_state,MESSAGE_SENDER_STATE previous_state)

{
  if (context != (void *)0x0) {
    *(MESSAGE_SENDER_STATE *)((long)context + 0x98) = new_state;
    if ((new_state == MESSAGE_SENDER_STATE_OPEN) && (*(int *)((long)context + 0x9c) == 3)) {
      *(undefined4 *)context = 1;
      if (*(code **)((long)context + 0xa0) != (code *)0x0) {
        (**(code **)((long)context + 0xa0))(*(undefined8 *)((long)context + 0xa8));
        return;
      }
    }
    else {
      *(undefined4 *)context = 0;
    }
  }
  return;
}

Assistant:

static void IoTHubMessaging_LL_SenderStateChanged(void* context, MESSAGE_SENDER_STATE new_state, MESSAGE_SENDER_STATE previous_state)
{
    (void)previous_state;
    if (context != NULL)
    {
        IOTHUB_MESSAGING* messagingData = (IOTHUB_MESSAGING*)context;
        messagingData->message_sender_state = new_state;

        if ((messagingData->message_sender_state == MESSAGE_SENDER_STATE_OPEN) && (messagingData->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN))
        {
            messagingData->isOpened = true;
            if (messagingData->callback_data.openCompleteCompleteCallback != NULL)
            {
                (messagingData->callback_data.openCompleteCompleteCallback)(messagingData->callback_data.openUserContext);
            }
        }
        else
        {
            messagingData->isOpened = false;
        }
    }
}